

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnViewPrivate::~QColumnViewPrivate(QColumnViewPrivate *this)

{
  QColumnViewPrivate *in_RDI;
  
  ~QColumnViewPrivate(in_RDI);
  operator_delete(in_RDI,0x5c0);
  return;
}

Assistant:

QColumnViewPrivate::~QColumnViewPrivate()
{
}